

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

pattern * distItem(void)

{
  char *pcVar1;
  pattern *ppVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  char msg [100];
  float local_90;
  float local_8c;
  char local_78 [104];
  
  ppVar2 = makeTerminal(0x13e,0);
  matchTok(0x194);
  if (lookahead == 0x191) {
    fVar3 = (float)tokenval;
  }
  else {
    fVar3 = realtokval;
    if (lookahead != 0x192) goto LAB_0012573f;
  }
  matchTok(lookahead);
  if ((((lookahead == 0x193) && (pcVar1 = SymTable[tokenval].lexptr, *pcVar1 == 'O')) &&
      (pcVar1[1] == 'F')) && (pcVar1[2] == '\0')) {
    matchTok(0x193);
    if (lookahead == 0x2d) {
      matchTok(0x2d);
      local_8c = -1.0;
    }
    else {
      local_8c = 1.0;
    }
    if (lookahead == 0x191) {
      fVar4 = (float)tokenval;
    }
    else {
      fVar4 = realtokval;
      if (lookahead != 0x192) goto LAB_0012573f;
    }
    matchTok(lookahead);
    if (lookahead == 0x2c) {
      matchTok(0x2c);
      if (lookahead == 0x2d) {
        matchTok(0x2d);
        local_90 = -1.0;
      }
      else {
        local_90 = 1.0;
      }
      if (lookahead == 0x191) {
        fVar5 = (float)tokenval;
      }
      else {
        fVar5 = realtokval;
        if (lookahead != 0x192) goto LAB_0012573f;
      }
      matchTok(lookahead);
      if (lookahead == 0x2c) {
        matchTok(0x2c);
        if (lookahead == 0x2d) {
          matchTok(0x2d);
          fVar7 = -1.0;
        }
        else {
          fVar7 = 1.0;
        }
        if (lookahead == 0x191) {
          fVar6 = (float)tokenval;
        }
        else {
          fVar6 = realtokval;
          if (lookahead != 0x192) goto LAB_0012573f;
        }
        matchTok(lookahead);
        ppVar2->fvec[0] = fVar3;
        ppVar2->fvec[1] = local_8c * fVar4;
        ppVar2->fvec[2] = local_90 * fVar5;
        ppVar2->fvec[3] = fVar7 * fVar6;
        return ppVar2;
      }
    }
  }
LAB_0012573f:
  describeLookahead(local_78,"syntax: parsing WITHIN: ");
  errmsg(local_78);
  ParseError = 1;
  return ppVar2;
}

Assistant:

pattern* distItem() {
   pattern *f;
   float dst = 0.0, px = 0.0, py = 0.0, pz = 0.0, signFactor = 0.0;
   int ok = 1;

/* within */
   f = makeTerminal(DIST_NODE, 0);
   matchTok(WITHIN_TOK);
/* distance */
   if (ok && lookahead == REALNUM_TOK) {
      dst = realtokval;
      matchTok(REALNUM_TOK);
   }
   else if (ok && lookahead == NUM_TOK) {
      dst = tokenval;
      matchTok(NUM_TOK);
   }
   else { ok = 0; }
/* of */
   if (ok && lookahead == ID_TOK
          && strcmp(SymTable[tokenval].lexptr, "OF") == 0) {
      matchTok(ID_TOK);
   }
   else { ok = 0; }
/* x */
   signFactor = 1.0;
   if (ok && lookahead == '-') {
      matchTok('-');
      signFactor = -1.0;
   }

   if (ok && lookahead == REALNUM_TOK) {
      px = signFactor * realtokval;
      matchTok(REALNUM_TOK);
   }
   else if (ok && lookahead == NUM_TOK) {
      px = signFactor * tokenval;
      matchTok(NUM_TOK);
   }
   else { ok = 0; }
/* , */
   if (ok && lookahead == ',') {
      matchTok(',');
   }
   else { ok = 0; }
/* y */
   signFactor = 1.0;
   if (ok && lookahead == '-') {
      matchTok('-');
      signFactor = -1.0;
   }

   if (ok && lookahead == REALNUM_TOK) {
      py = signFactor * realtokval;
      matchTok(REALNUM_TOK);
   }
   else if (ok && lookahead == NUM_TOK) {
      py = signFactor * tokenval;
      matchTok(NUM_TOK);
   }
   else { ok = 0; }
/* , */
   if (ok && lookahead == ',') {
      matchTok(',');
   }
   else { ok = 0; }
/* z */
   signFactor = 1.0;
   if (ok && lookahead == '-') {
      matchTok('-');
      signFactor = -1.0;
   }

   if (ok && lookahead == REALNUM_TOK) {
      pz = signFactor * realtokval;
      matchTok(REALNUM_TOK);
   }
   else if (ok && lookahead == NUM_TOK) {
      pz = signFactor * tokenval;
      matchTok(NUM_TOK);
   }
   else { ok = 0; }

/* info is packed into the floating-point vector */
   if (ok) {
      f->fvec[0] = dst;
      f->fvec[1] = px;
      f->fvec[2] = py;
      f->fvec[3] = pz;
   }
   else {
      char msg[100];
      describeLookahead(msg,"syntax: parsing WITHIN: ");
      errmsg(msg);
      ParseError = TRUE;
   }
   return f;
}